

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p,uchar *tweak32)

{
  int iVar1;
  int overflow;
  secp256k1_scalar term;
  secp256k1_gej pt;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  int local_9bc;
  secp256k1_scalar local_9b8;
  secp256k1_strauss_state local_998;
  secp256k1_gej local_980;
  secp256k1_fe local_8e8 [8];
  secp256k1_ge local_768 [8];
  secp256k1_strauss_point_state local_428;
  
  local_9bc = 0;
  secp256k1_scalar_set_b32(&local_9b8,tweak32,&local_9bc);
  iVar1 = 0;
  if (local_9bc == 0) {
    secp256k1_gej_set_ge(&local_980,p);
    local_998.aux = local_8e8;
    local_998.pre_a = local_768;
    local_998.ps = &local_428;
    secp256k1_ecmult_strauss_wnaf
              (&local_998,&local_980,1,&local_980,&secp256k1_scalar_one,&local_9b8);
    secp256k1_gej_verify(&local_980);
    iVar1 = 0;
    if (local_980.infinity == 0) {
      secp256k1_ge_set_gej(p,&local_980);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    return !overflow && secp256k1_eckey_pubkey_tweak_add(p, &term);
}